

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int readsTable(Parse *p,int iDb,Table *pTab)

{
  int iVar1;
  Vdbe *p_00;
  VTable *pVVar2;
  VdbeOp *pVVar3;
  Table *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  Pgno tnum;
  Index *pIndex;
  VdbeOp *pOp;
  VTable *pVTab;
  int iEnd;
  int i;
  Vdbe *v;
  Parse *in_stack_ffffffffffffffa8;
  Index *local_48;
  int local_2c;
  
  p_00 = sqlite3GetVdbe(in_stack_ffffffffffffffa8);
  iVar1 = sqlite3VdbeCurrentAddr(p_00);
  if (in_RDX->eTabType == '\x01') {
    pVVar2 = sqlite3GetVTable((sqlite3 *)*in_RDI,in_RDX);
  }
  else {
    pVVar2 = (VTable *)0x0;
  }
  local_2c = 1;
  while( true ) {
    if (iVar1 <= local_2c) {
      return 0;
    }
    pVVar3 = sqlite3VdbeGetOp(p_00,local_2c);
    if ((pVVar3->opcode == 'f') && (pVVar3->p3 == in_ESI)) {
      if (pVVar3->p2 == in_RDX->tnum) {
        return 1;
      }
      for (local_48 = in_RDX->pIndex; local_48 != (Index *)0x0; local_48 = local_48->pNext) {
        if (pVVar3->p2 == local_48->tnum) {
          return 1;
        }
      }
    }
    if ((pVVar3->opcode == 0xad) && ((VTable *)(pVVar3->p4).p == pVVar2)) break;
    local_2c = local_2c + 1;
  }
  return 1;
}

Assistant:

static int readsTable(Parse *p, int iDb, Table *pTab){
  Vdbe *v = sqlite3GetVdbe(p);
  int i;
  int iEnd = sqlite3VdbeCurrentAddr(v);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  VTable *pVTab = IsVirtual(pTab) ? sqlite3GetVTable(p->db, pTab) : 0;
#endif

  for(i=1; i<iEnd; i++){
    VdbeOp *pOp = sqlite3VdbeGetOp(v, i);
    assert( pOp!=0 );
    if( pOp->opcode==OP_OpenRead && pOp->p3==iDb ){
      Index *pIndex;
      Pgno tnum = pOp->p2;
      if( tnum==pTab->tnum ){
        return 1;
      }
      for(pIndex=pTab->pIndex; pIndex; pIndex=pIndex->pNext){
        if( tnum==pIndex->tnum ){
          return 1;
        }
      }
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( pOp->opcode==OP_VOpen && pOp->p4.pVtab==pVTab ){
      assert( pOp->p4.pVtab!=0 );
      assert( pOp->p4type==P4_VTAB );
      return 1;
    }
#endif
  }
  return 0;
}